

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,undefined4 param_2)

{
  StrWriter *this_local;
  Cc cc_local;
  
  switch(param_2) {
  case 0:
    operator<<(this,"t");
    break;
  case 1:
    operator<<(this,"f");
    break;
  case 2:
    operator<<(this,"hi");
    break;
  case 3:
    operator<<(this,"ls");
    break;
  case 4:
    operator<<(this,"cc");
    break;
  case 5:
    operator<<(this,"cs");
    break;
  case 6:
    operator<<(this,"ne");
    break;
  case 7:
    operator<<(this,"eq");
    break;
  case 8:
    operator<<(this,"vc");
    break;
  case 9:
    operator<<(this,"vs");
    break;
  case 10:
    operator<<(this,"pl");
    break;
  case 0xb:
    operator<<(this,"mi");
    break;
  case 0xc:
    operator<<(this,"ge");
    break;
  case 0xd:
    operator<<(this,"lt");
    break;
  case 0xe:
    operator<<(this,"gt");
    break;
  case 0xf:
    operator<<(this,"le");
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Cc cc)
{
    switch (Cond(cc.raw)) {

        case Cond::BT: *this << "t";   break;
        case Cond::BF: *this << "f";   break;
        case Cond::HI: *this << "hi";  break;
        case Cond::LS: *this << "ls";  break;
        case Cond::CC: *this << "cc";  break;
        case Cond::CS: *this << "cs";  break;
        case Cond::NE: *this << "ne";  break;
        case Cond::EQ: *this << "eq";  break;
        case Cond::VC: *this << "vc";  break;
        case Cond::VS: *this << "vs";  break;
        case Cond::PL: *this << "pl";  break;
        case Cond::MI: *this << "mi";  break;
        case Cond::GE: *this << "ge";  break;
        case Cond::LT: *this << "lt";  break;
        case Cond::GT: *this << "gt";  break;
        case Cond::LE: *this << "le";  break;
    }
    return *this;
}